

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O1

void * dja::mat3::memcpy(void *__dest,void *__src,size_t __n)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  
  uVar1 = *__src;
  uVar10 = *(undefined4 *)((long)__src + 4);
  uVar11 = *(undefined4 *)((long)__src + 8);
  uVar2 = *(undefined4 *)((long)__src + 0xc);
  uVar3 = *(undefined4 *)((long)__src + 0x10);
  uVar12 = *(undefined4 *)((long)__src + 0x14);
  uVar4 = *(undefined4 *)((long)__src + 0x18);
  uVar5 = *(undefined4 *)((long)__src + 0x1c);
  uVar6 = *(undefined4 *)((long)__src + 0x20);
  uVar7 = uVar4;
  uVar8 = uVar2;
  uVar9 = uVar5;
  if ((int)__n == 0) {
    *(undefined8 *)((long)__dest + 0x10) = 0;
    *(undefined8 *)((long)__dest + 0x18) = 0;
    *(undefined8 *)__dest = 0;
    *(undefined8 *)((long)__dest + 8) = 0;
    *(undefined4 *)((long)__dest + 0x20) = 0;
    uVar7 = uVar11;
    uVar8 = uVar10;
    uVar9 = uVar12;
    uVar10 = uVar2;
    uVar11 = uVar4;
    uVar12 = uVar5;
  }
  *(undefined4 *)__dest = uVar1;
  *(undefined4 *)((long)__dest + 4) = uVar10;
  *(undefined4 *)((long)__dest + 8) = uVar11;
  *(undefined4 *)((long)__dest + 0xc) = uVar8;
  *(undefined4 *)((long)__dest + 0x10) = uVar3;
  *(undefined4 *)((long)__dest + 0x14) = uVar12;
  *(undefined4 *)((long)__dest + 0x18) = uVar7;
  *(undefined4 *)((long)__dest + 0x1c) = uVar9;
  *(undefined4 *)((long)__dest + 0x20) = uVar6;
  return __dest;
}

Assistant:

mat3 mat3::memcpy(const float_t *v, bool rowmajor)
{
    mat3 m;
    std::memcpy(&m[0][0], v, sizeof(mat3));
    return rowmajor ? m : transpose(m);
}